

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O0

void __thiscall
Secp256k1_TweakPrivkeySecp256k1EcTest_Test::~Secp256k1_TweakPrivkeySecp256k1EcTest_Test
          (Secp256k1_TweakPrivkeySecp256k1EcTest_Test *this)

{
  Secp256k1_TweakPrivkeySecp256k1EcTest_Test *this_local;
  
  ~Secp256k1_TweakPrivkeySecp256k1EcTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Secp256k1, TweakPrivkeySecp256k1EcTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPrivkeyTestVector test_vector : tweak_privkey_test_vectors) {
    ByteData actual_add;
    EXPECT_NO_THROW(
        actual_add = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey,
            test_vector.tweak));
    EXPECT_EQ(test_vector.expect_add, actual_add.GetHex());

    ByteData actual_mul;
    EXPECT_NO_THROW(
        actual_mul = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey,
            test_vector.tweak));
    EXPECT_EQ(test_vector.expect_mul, actual_mul.GetHex());
  }
}